

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O1

LBBox3fa * __thiscall
embree::avx::PointsISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,PointsISA *this,LinearSpace3fa *space,size_t primID,
          BBox1f *time_range)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  size_t *psVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar41;
  float fVar42;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar43 [16];
  float fVar49;
  undefined1 auVar44 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  fVar1 = (this->super_Points).super_Geometry.fnumTimeSegments;
  fVar33 = (this->super_Points).super_Geometry.time_range.lower;
  fVar30 = (this->super_Points).super_Geometry.time_range.upper - fVar33;
  fVar26 = (time_range->lower - fVar33) / fVar30;
  fVar30 = (time_range->upper - fVar33) / fVar30;
  fVar33 = fVar1 * fVar26;
  fVar38 = fVar1 * fVar30;
  auVar31 = vroundss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33),9);
  auVar44 = vroundss_avx(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38),10);
  auVar28 = ZEXT816(0) << 0x40;
  auVar27 = vmaxss_avx(auVar31,auVar28);
  auVar43 = vminss_avx(auVar44,ZEXT416((uint)fVar1));
  fVar40 = auVar27._0_4_;
  fVar39 = auVar43._0_4_;
  iVar21 = -1;
  if (-1 < (int)auVar31._0_4_) {
    iVar21 = (int)auVar31._0_4_;
  }
  uVar7 = (int)fVar1 + 1U;
  if ((int)auVar44._0_4_ < (int)((int)fVar1 + 1U)) {
    uVar7 = (int)auVar44._0_4_;
  }
  lVar23 = (long)(int)fVar40;
  pBVar5 = (this->super_Points).vertices.items;
  pcVar6 = pBVar5[lVar23].super_RawBufferView.ptr_ofs;
  lVar25 = pBVar5[lVar23].super_RawBufferView.stride * primID;
  fVar42 = *(float *)(pcVar6 + lVar25);
  fVar2 = *(float *)(pcVar6 + lVar25 + 4);
  fVar46 = *(float *)(pcVar6 + lVar25 + 8);
  fVar8 = (space->vx).field_0.m128[0];
  fVar9 = (space->vx).field_0.m128[1];
  fVar10 = (space->vx).field_0.m128[2];
  fVar11 = (space->vx).field_0.m128[3];
  fVar12 = (space->vy).field_0.m128[0];
  fVar13 = (space->vy).field_0.m128[1];
  fVar14 = (space->vy).field_0.m128[2];
  fVar15 = (space->vy).field_0.m128[3];
  fVar16 = (space->vz).field_0.m128[0];
  fVar17 = (space->vz).field_0.m128[1];
  fVar18 = (space->vz).field_0.m128[2];
  fVar19 = (space->vz).field_0.m128[3];
  auVar27._0_4_ = fVar46 * fVar16 + fVar2 * fVar12 + fVar42 * fVar8;
  auVar27._4_4_ = fVar46 * fVar17 + fVar2 * fVar13 + fVar42 * fVar9;
  auVar27._8_4_ = fVar46 * fVar18 + fVar2 * fVar14 + fVar42 * fVar10;
  auVar27._12_4_ = fVar46 * fVar19 + fVar2 * fVar15 + fVar42 * fVar11;
  fVar42 = *(float *)(pcVar6 + lVar25 + 0xc);
  auVar43._4_4_ = fVar42;
  auVar43._0_4_ = fVar42;
  auVar43._8_4_ = fVar42;
  auVar43._12_4_ = fVar42;
  auVar27 = vblendps_avx(auVar27,auVar43,8);
  fVar2 = (this->super_Points).maxRadiusScale;
  auVar43 = vshufps_avx(ZEXT416((uint)(fVar42 * fVar2)),ZEXT416((uint)(fVar42 * fVar2)),0);
  auVar31 = vsubps_avx(auVar27,auVar43);
  fVar41 = auVar27._0_4_ + auVar43._0_4_;
  fVar45 = auVar27._4_4_ + auVar43._4_4_;
  fVar47 = auVar27._8_4_ + auVar43._8_4_;
  fVar49 = auVar27._12_4_ + auVar43._12_4_;
  lVar25 = (long)(int)fVar39;
  pcVar6 = pBVar5[lVar25].super_RawBufferView.ptr_ofs;
  lVar24 = pBVar5[lVar25].super_RawBufferView.stride * primID;
  fVar42 = *(float *)(pcVar6 + lVar24 + 4);
  fVar46 = *(float *)(pcVar6 + lVar24 + 8);
  fVar48 = *(float *)(pcVar6 + lVar24);
  auVar44._0_4_ = fVar48 * fVar8 + fVar46 * fVar16 + fVar42 * fVar12;
  auVar44._4_4_ = fVar48 * fVar9 + fVar46 * fVar17 + fVar42 * fVar13;
  auVar44._8_4_ = fVar48 * fVar10 + fVar46 * fVar18 + fVar42 * fVar14;
  auVar44._12_4_ = fVar48 * fVar11 + fVar46 * fVar19 + fVar42 * fVar15;
  fVar42 = *(float *)(pcVar6 + lVar24 + 0xc);
  auVar56._4_4_ = fVar42;
  auVar56._0_4_ = fVar42;
  auVar56._8_4_ = fVar42;
  auVar56._12_4_ = fVar42;
  auVar27 = vblendps_avx(auVar44,auVar56,8);
  auVar43 = vshufps_avx(ZEXT416((uint)(fVar42 * fVar2)),ZEXT416((uint)(fVar42 * fVar2)),0);
  auVar44 = vsubps_avx(auVar27,auVar43);
  fVar62 = auVar43._0_4_ + auVar27._0_4_;
  fVar63 = auVar43._4_4_ + auVar27._4_4_;
  fVar64 = auVar43._8_4_ + auVar27._8_4_;
  fVar65 = auVar43._12_4_ + auVar27._12_4_;
  fVar42 = auVar44._0_4_;
  fVar46 = auVar44._4_4_;
  fVar48 = auVar44._8_4_;
  fVar50 = auVar44._12_4_;
  fVar51 = auVar31._0_4_;
  fVar52 = auVar31._4_4_;
  fVar53 = auVar31._8_4_;
  fVar54 = auVar31._12_4_;
  if (uVar7 - iVar21 == 1) {
    auVar27 = vmaxss_avx(ZEXT416((uint)(fVar33 - fVar40)),auVar28);
    auVar43 = vshufps_avx(auVar27,auVar27,0);
    auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
    auVar27 = vshufps_avx(auVar27,auVar27,0);
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] =
         fVar51 * auVar27._0_4_ + fVar42 * auVar43._0_4_;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] =
         fVar52 * auVar27._4_4_ + fVar46 * auVar43._4_4_;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] =
         fVar53 * auVar27._8_4_ + fVar48 * auVar43._8_4_;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] =
         fVar54 * auVar27._12_4_ + fVar50 * auVar43._12_4_;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] =
         auVar27._0_4_ * fVar41 + fVar62 * auVar43._0_4_;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] =
         auVar27._4_4_ * fVar45 + fVar63 * auVar43._4_4_;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] =
         auVar27._8_4_ * fVar47 + fVar64 * auVar43._8_4_;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] =
         auVar27._12_4_ * fVar49 + fVar65 * auVar43._12_4_;
    auVar27 = vmaxss_avx(ZEXT416((uint)(fVar39 - fVar38)),auVar28);
    auVar43 = vshufps_avx(auVar27,auVar27,0);
    auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
    auVar27 = vshufps_avx(auVar27,auVar27,0);
    fVar33 = fVar51 * auVar43._0_4_ + fVar42 * auVar27._0_4_;
    fVar38 = fVar52 * auVar43._4_4_ + fVar46 * auVar27._4_4_;
    fVar39 = fVar53 * auVar43._8_4_ + fVar48 * auVar27._8_4_;
    fVar40 = fVar54 * auVar43._12_4_ + fVar50 * auVar27._12_4_;
    fVar42 = auVar43._0_4_ * fVar41 + fVar62 * auVar27._0_4_;
    fVar46 = auVar43._4_4_ * fVar45 + fVar63 * auVar27._4_4_;
    fVar48 = auVar43._8_4_ * fVar47 + fVar64 * auVar27._8_4_;
    fVar41 = auVar43._12_4_ * fVar49 + fVar65 * auVar27._12_4_;
  }
  else {
    pcVar6 = pBVar5[lVar23 + 1].super_RawBufferView.ptr_ofs;
    lVar23 = pBVar5[lVar23 + 1].super_RawBufferView.stride * primID;
    fVar55 = *(float *)(pcVar6 + lVar23);
    fVar3 = *(float *)(pcVar6 + lVar23 + 4);
    fVar4 = *(float *)(pcVar6 + lVar23 + 8);
    auVar31._0_4_ = fVar55 * fVar8 + fVar16 * fVar4 + fVar12 * fVar3;
    auVar31._4_4_ = fVar55 * fVar9 + fVar17 * fVar4 + fVar13 * fVar3;
    auVar31._8_4_ = fVar55 * fVar10 + fVar18 * fVar4 + fVar14 * fVar3;
    auVar31._12_4_ = fVar55 * fVar11 + fVar19 * fVar4 + fVar15 * fVar3;
    fVar55 = *(float *)(pcVar6 + lVar23 + 0xc);
    auVar34._4_4_ = fVar55;
    auVar34._0_4_ = fVar55;
    auVar34._8_4_ = fVar55;
    auVar34._12_4_ = fVar55;
    auVar27 = vblendps_avx(auVar31,auVar34,8);
    auVar35._0_4_ = fVar2 * fVar55;
    auVar35._4_4_ = fVar2 * fVar55;
    auVar35._8_4_ = fVar2 * fVar55;
    auVar35._12_4_ = fVar2 * fVar55;
    auVar56 = vsubps_avx(auVar27,auVar35);
    pcVar6 = pBVar5[lVar25 + -1].super_RawBufferView.ptr_ofs;
    lVar25 = pBVar5[lVar25 + -1].super_RawBufferView.stride * primID;
    fVar55 = *(float *)(pcVar6 + lVar25);
    fVar3 = *(float *)(pcVar6 + lVar25 + 4);
    fVar4 = *(float *)(pcVar6 + lVar25 + 8);
    auVar32._0_4_ = fVar8 * fVar55 + fVar3 * fVar12 + fVar16 * fVar4;
    auVar32._4_4_ = fVar9 * fVar55 + fVar3 * fVar13 + fVar17 * fVar4;
    auVar32._8_4_ = fVar10 * fVar55 + fVar3 * fVar14 + fVar18 * fVar4;
    auVar32._12_4_ = fVar11 * fVar55 + fVar3 * fVar15 + fVar19 * fVar4;
    fVar55 = *(float *)(pcVar6 + lVar25 + 0xc);
    auVar36._4_4_ = fVar55;
    auVar36._0_4_ = fVar55;
    auVar36._8_4_ = fVar55;
    auVar36._12_4_ = fVar55;
    auVar43 = vblendps_avx(auVar32,auVar36,8);
    auVar37._0_4_ = fVar2 * fVar55;
    auVar37._4_4_ = fVar2 * fVar55;
    auVar37._8_4_ = fVar2 * fVar55;
    auVar37._12_4_ = fVar2 * fVar55;
    auVar32 = vsubps_avx(auVar43,auVar37);
    auVar31 = vmaxss_avx(ZEXT416((uint)(fVar33 - fVar40)),auVar28);
    auVar44 = vshufps_avx(auVar31,auVar31,0);
    local_38 = auVar56._0_4_;
    fStack_34 = auVar56._4_4_;
    fStack_30 = auVar56._8_4_;
    fStack_2c = auVar56._12_4_;
    auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
    auVar31 = vshufps_avx(auVar31,auVar31,0);
    fVar51 = auVar31._0_4_ * fVar51 + auVar44._0_4_ * local_38;
    fVar52 = auVar31._4_4_ * fVar52 + auVar44._4_4_ * fStack_34;
    fVar53 = auVar31._8_4_ * fVar53 + auVar44._8_4_ * fStack_30;
    fVar54 = auVar31._12_4_ * fVar54 + auVar44._12_4_ * fStack_2c;
    fVar55 = auVar31._0_4_ * fVar41 + auVar44._0_4_ * (auVar35._0_4_ + auVar27._0_4_);
    fVar45 = auVar31._4_4_ * fVar45 + auVar44._4_4_ * (auVar35._4_4_ + auVar27._4_4_);
    fVar47 = auVar31._8_4_ * fVar47 + auVar44._8_4_ * (auVar35._8_4_ + auVar27._8_4_);
    fVar49 = auVar31._12_4_ * fVar49 + auVar44._12_4_ * (auVar35._12_4_ + auVar27._12_4_);
    auVar27 = vmaxss_avx(ZEXT416((uint)(fVar39 - fVar38)),ZEXT416(0));
    auVar31 = vshufps_avx(auVar27,auVar27,0);
    auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
    auVar27 = vshufps_avx(auVar27,auVar27,0);
    fVar33 = auVar27._0_4_ * fVar42 + auVar31._0_4_ * auVar32._0_4_;
    fVar38 = auVar27._4_4_ * fVar46 + auVar31._4_4_ * auVar32._4_4_;
    fVar39 = auVar27._8_4_ * fVar48 + auVar31._8_4_ * auVar32._8_4_;
    fVar40 = auVar27._12_4_ * fVar50 + auVar31._12_4_ * auVar32._12_4_;
    fVar42 = auVar27._0_4_ * fVar62 + auVar31._0_4_ * (auVar37._0_4_ + auVar43._0_4_);
    fVar46 = auVar27._4_4_ * fVar63 + auVar31._4_4_ * (auVar37._4_4_ + auVar43._4_4_);
    fVar48 = auVar27._8_4_ * fVar64 + auVar31._8_4_ * (auVar37._8_4_ + auVar43._8_4_);
    fVar41 = auVar27._12_4_ * fVar65 + auVar31._12_4_ * (auVar37._12_4_ + auVar43._12_4_);
    uVar22 = iVar21 + 1;
    if ((int)uVar22 < (int)uVar7) {
      psVar20 = &pBVar5[uVar22].super_RawBufferView.stride;
      do {
        auVar58._0_4_ = ((float)(int)uVar22 / fVar1 - fVar26) / (fVar30 - fVar26);
        auVar58._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar27 = vshufps_avx(auVar58,auVar58,0);
        auVar43 = vshufps_avx(ZEXT416((uint)(1.0 - auVar58._0_4_)),
                              ZEXT416((uint)(1.0 - auVar58._0_4_)),0);
        auVar57._0_4_ = auVar27._0_4_ * fVar33 + fVar51 * auVar43._0_4_;
        auVar57._4_4_ = auVar27._4_4_ * fVar38 + fVar52 * auVar43._4_4_;
        auVar57._8_4_ = auVar27._8_4_ * fVar39 + fVar53 * auVar43._8_4_;
        auVar57._12_4_ = auVar27._12_4_ * fVar40 + fVar54 * auVar43._12_4_;
        auVar59._0_4_ = fVar42 * auVar27._0_4_ + fVar55 * auVar43._0_4_;
        auVar59._4_4_ = fVar46 * auVar27._4_4_ + fVar45 * auVar43._4_4_;
        auVar59._8_4_ = fVar48 * auVar27._8_4_ + fVar47 * auVar43._8_4_;
        auVar59._12_4_ = fVar41 * auVar27._12_4_ + fVar49 * auVar43._12_4_;
        pcVar6 = ((RawBufferView *)(psVar20 + -2))->ptr_ofs;
        lVar25 = *psVar20 * primID;
        fVar50 = *(float *)(pcVar6 + lVar25);
        fVar62 = *(float *)(pcVar6 + lVar25 + 4);
        fVar63 = *(float *)(pcVar6 + lVar25 + 8);
        auVar28._0_4_ = fVar50 * fVar8 + fVar62 * fVar12 + fVar16 * fVar63;
        auVar28._4_4_ = fVar50 * fVar9 + fVar62 * fVar13 + fVar17 * fVar63;
        auVar28._8_4_ = fVar50 * fVar10 + fVar62 * fVar14 + fVar18 * fVar63;
        auVar28._12_4_ = fVar50 * fVar11 + fVar62 * fVar15 + fVar19 * fVar63;
        fVar50 = *(float *)(pcVar6 + lVar25 + 0xc);
        auVar60._4_4_ = fVar50;
        auVar60._0_4_ = fVar50;
        auVar60._8_4_ = fVar50;
        auVar60._12_4_ = fVar50;
        auVar27 = vblendps_avx(auVar28,auVar60,8);
        auVar61._0_4_ = fVar50 * fVar2;
        auVar61._4_4_ = fVar50 * fVar2;
        auVar61._8_4_ = fVar50 * fVar2;
        auVar61._12_4_ = fVar50 * fVar2;
        auVar43 = vsubps_avx(auVar27,auVar61);
        auVar43 = vsubps_avx(auVar43,auVar57);
        auVar29._0_4_ = auVar61._0_4_ + auVar27._0_4_;
        auVar29._4_4_ = auVar61._4_4_ + auVar27._4_4_;
        auVar29._8_4_ = auVar61._8_4_ + auVar27._8_4_;
        auVar29._12_4_ = auVar61._12_4_ + auVar27._12_4_;
        auVar31 = vsubps_avx(auVar29,auVar59);
        auVar27 = vminps_avx(auVar43,ZEXT816(0) << 0x20);
        fVar51 = fVar51 + auVar27._0_4_;
        fVar52 = fVar52 + auVar27._4_4_;
        fVar53 = fVar53 + auVar27._8_4_;
        fVar54 = fVar54 + auVar27._12_4_;
        fVar33 = auVar27._0_4_ + fVar33;
        fVar38 = auVar27._4_4_ + fVar38;
        fVar39 = auVar27._8_4_ + fVar39;
        fVar40 = auVar27._12_4_ + fVar40;
        auVar27 = vmaxps_avx(auVar31,ZEXT816(0) << 0x20);
        fVar55 = fVar55 + auVar27._0_4_;
        fVar45 = fVar45 + auVar27._4_4_;
        fVar47 = fVar47 + auVar27._8_4_;
        fVar49 = fVar49 + auVar27._12_4_;
        fVar42 = fVar42 + auVar27._0_4_;
        fVar46 = fVar46 + auVar27._4_4_;
        fVar48 = fVar48 + auVar27._8_4_;
        fVar41 = fVar41 + auVar27._12_4_;
        uVar22 = uVar22 + 1;
        psVar20 = psVar20 + 7;
      } while (uVar7 != uVar22);
    }
    (__return_storage_ptr__->bounds0).lower.field_0.m128[0] = fVar51;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[1] = fVar52;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[2] = fVar53;
    (__return_storage_ptr__->bounds0).lower.field_0.m128[3] = fVar54;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[0] = fVar55;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[1] = fVar45;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[2] = fVar47;
    (__return_storage_ptr__->bounds0).upper.field_0.m128[3] = fVar49;
  }
  (__return_storage_ptr__->bounds1).lower.field_0.m128[0] = fVar33;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[1] = fVar38;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[2] = fVar39;
  (__return_storage_ptr__->bounds1).lower.field_0.m128[3] = fVar40;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[0] = fVar42;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[1] = fVar46;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[2] = fVar48;
  (__return_storage_ptr__->bounds1).upper.field_0.m128[3] = fVar41;
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(const LinearSpace3fa& space, size_t primID, const BBox1f& time_range) const
      {
        return linearBounds(space, primID, time_range);
      }